

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  ostream *poVar2;
  function<double_(int)> *func_00;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> output;
  undefined1 local_d0 [8];
  function<double_(int)> func;
  double local_a8 [4];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<double,_std::allocator<double>_> expectedMap;
  allocator<int> local_49;
  int local_48 [4];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> test;
  
  test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_48[0] = 1;
  local_48[1] = 3;
  local_48[2] = 0x22;
  local_48[3] = 0x32;
  local_38 = local_48;
  local_30 = 4;
  std::allocator<int>::allocator(&local_49);
  __l_00._M_len = local_30;
  __l_00._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l_00,&local_49);
  std::allocator<int>::~allocator(&local_49);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test map...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_a8[2] = 68.0;
  local_a8[3] = 100.0;
  local_a8[0] = 2.0;
  local_a8[1] = 6.0;
  local_88 = local_a8;
  local_80 = 4;
  func_00 = (function<double_(int)> *)((long)&func._M_invoker + 7);
  std::allocator<double>::allocator((allocator<double> *)func_00);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_78,__l,(allocator_type *)func_00);
  std::allocator<double>::~allocator((allocator<double> *)((long)&func._M_invoker + 7));
  std::function<double(int)>::function<main::__0,void>
            ((function<double(int)> *)local_d0,
             (anon_class_1_0_00000001 *)
             ((long)&output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  Functional::map<std::vector,int,std::allocator<int>,double,std::allocator<double>>
            ((vector<double,_std::allocator<double>_> *)local_f0,(Functional *)local_28,
             (vector<int,_std::allocator<int>_> *)local_d0,func_00);
  bVar1 = std::operator==((vector<double,_std::allocator<double>_> *)local_78,
                          (vector<double,_std::allocator<double>_> *)local_f0);
  if (!bVar1) {
    __assert_fail("expectedMap==output",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/map/main.cpp"
                  ,0x14,"int main()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_f0);
  std::function<double_(int)>::~function((function<double_(int)> *)local_d0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main(){

    
  
  vector<int> test={1, 3, 34, 50};
  
  cout << "Test map..." << endl;
  vector<double> expectedMap={2, 6, 68, 100};
  function< double(int) > func= [] (const int & element){return 2.0*element;};   
  vector<double> output= Functional::map( test,  func );
  assert(expectedMap==output);
  cout << "passed!" << endl;
 
  return 0;

}